

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_25095d::DotSuffix::printLeft(DotSuffix *this,OutputStream *s)

{
  StringView R;
  StringView R_00;
  
  Node::print(this->Prefix,s);
  R.Last = "";
  R.First = " (";
  OutputStream::operator+=(s,R);
  OutputStream::operator+=(s,this->Suffix);
  R_00.Last = "";
  R_00.First = ")";
  OutputStream::operator+=(s,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    Prefix->print(s);
    s += " (";
    s += Suffix;
    s += ")";
  }